

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::SequenceFeatureType::Clear(SequenceFeatureType *this)

{
  if (this->sizerange_ != (SizeRange *)0x0) {
    (*(this->sizerange_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->sizerange_ = (SizeRange *)0x0;
  clear_Type(this);
  return;
}

Assistant:

void SequenceFeatureType::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.SequenceFeatureType)
  if (GetArenaNoVirtual() == NULL && sizerange_ != NULL) {
    delete sizerange_;
  }
  sizerange_ = NULL;
  clear_Type();
}